

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTransformFeedbackTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Functional::TransformFeedback::RandomCase::init(RandomCase *this,EVP_PKEY_CTX *ctx)

{
  ProgramSpec *this_00;
  pointer __x;
  pointer pVVar1;
  int iVar2;
  int iVar3;
  DataType dataType;
  Precision precision;
  DataType DVar4;
  Interpolation interp;
  int iVar5;
  int extraout_EAX;
  int iVar6;
  long lVar7;
  int iVar8;
  pointer pbVar9;
  string *__return_storage_ptr__;
  float fVar10;
  float fVar11;
  float fVar12;
  long lStack_130;
  int varNdx;
  long local_118;
  deUint32 local_110;
  int local_10c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tfVaryings;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tfCandidates;
  Random rnd;
  string local_90;
  string local_70;
  string local_50;
  
  local_110 = (this->super_TransformFeedbackCase).m_bufferMode;
  iVar6 = 0x10;
  if (local_110 == 0x8c8d) {
    iVar6 = 4;
  }
  deRandom_init(&rnd.m_rnd,*(deUint32 *)&(this->super_TransformFeedbackCase).field_0x144);
  fVar10 = deRandom_getFloat(&rnd.m_rnd);
  fVar11 = deRandom_getFloat(&rnd.m_rnd);
  iVar2 = de::Random::getInt((Random *)&rnd.m_rnd,1,fVar11 < 0.1 ^ 0xf);
  varNdx = 0;
  this_00 = &(this->super_TransformFeedbackCase).m_progSpec;
  iVar8 = 0;
  do {
    iVar3 = iVar2 - iVar8;
    if (iVar3 == 0 || iVar2 < iVar8) {
      tfCandidates.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      tfCandidates.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      tfCandidates.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      if (fVar10 < 0.7) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&tfVaryings,"gl_Position",(allocator<char> *)&local_90);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &tfCandidates,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tfVaryings)
        ;
        std::__cxx11::string::~string((string *)&tfVaryings);
      }
      if (fVar11 < 0.1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&tfVaryings,"gl_PointSize",(allocator<char> *)&local_90);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &tfCandidates,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tfVaryings)
        ;
        std::__cxx11::string::~string((string *)&tfVaryings);
      }
      lVar7 = 0;
      while (lVar7 < varNdx) {
        pVVar1 = (this->super_TransformFeedbackCase).m_progSpec.m_varyings.
                 super__Vector_base<deqp::gles3::Functional::TransformFeedback::Varying,_std::allocator<deqp::gles3::Functional::TransformFeedback::Varying>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        __x = pVVar1 + lVar7;
        local_118 = lVar7;
        if (pVVar1[lVar7].type.m_type == TYPE_ARRAY) {
          fVar10 = deRandom_getFloat(&rnd.m_rnd);
          if (0.5 <= fVar10) {
            iVar2 = (__x->type).m_data.array.size;
            for (local_10c = 0; local_10c < iVar2; local_10c = local_10c + 1) {
              std::operator+(&local_70,&__x->name,"[");
              de::toString<int>(&local_50,&local_10c);
              std::operator+(&local_90,&local_70,&local_50);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &tfVaryings,&local_90,"]");
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &tfCandidates,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &tfVaryings);
              std::__cxx11::string::~string((string *)&tfVaryings);
              std::__cxx11::string::~string((string *)&local_90);
              std::__cxx11::string::~string((string *)&local_50);
              std::__cxx11::string::~string((string *)&local_70);
            }
          }
          else {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&tfCandidates,&__x->name);
          }
        }
        else {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&tfCandidates,&__x->name);
        }
        lVar7 = local_118 + 1;
      }
      iVar2 = (int)((ulong)((long)tfCandidates.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)tfCandidates.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 5);
      if (iVar2 < iVar6) {
        iVar6 = iVar2;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&tfVaryings,(long)iVar6,(allocator_type *)&local_90);
      de::Random::
      choose<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                (&rnd,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       )tfCandidates.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )tfCandidates.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )tfVaryings.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                 (int)((ulong)((long)tfVaryings.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)tfVaryings.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 5));
      pbVar9 = tfVaryings.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      de::Random::
      shuffle<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                (&rnd,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       )tfVaryings.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )tfVaryings.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
      for (; tfVaryings.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             tfVaryings.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
          tfVaryings.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               tfVaryings.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 1) {
        pbVar9 = (pointer)((tfVaryings.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
        ProgramSpec::addTransformFeedbackVarying(this_00,(char *)pbVar9);
      }
      TransformFeedbackCase::init(&this->super_TransformFeedbackCase,(EVP_PKEY_CTX *)pbVar9);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&tfVaryings);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&tfCandidates);
      return extraout_EAX;
    }
    if (local_110 == 0x8c8d) {
      if (1 < iVar3) {
        iVar3 = 2;
      }
      lStack_130 = 0xd;
LAB_01040e8a:
      lVar7 = lStack_130;
      iVar5 = iVar3;
      if (iVar3 < 2) {
        lVar7 = 0xc;
      }
    }
    else if (iVar3 < 4) {
      lStack_130 = 0xf;
      lVar7 = 0x12;
      iVar5 = 3;
      if (iVar3 != 3) goto LAB_01040e8a;
    }
    else {
      lVar7 = 0x15;
      iVar5 = iVar3;
    }
    dataType = de::Random::choose<glu::DataType,glu::DataType_const*>
                         (&rnd,init::typeCandidates,init::typeCandidates + lVar7);
    precision = de::Random::choose<glu::Precision,glu::Precision_const*>
                          (&rnd,init::precisions,init::interpModes);
    DVar4 = glu::getDataTypeScalarType(dataType);
    interp = INTERPOLATION_FLAT;
    if (DVar4 == TYPE_FLOAT) {
      interp = de::Random::
               choose<deqp::gles3::Functional::TransformFeedback::Interpolation,deqp::gles3::Functional::TransformFeedback::Interpolation_const*>
                         (&rnd,init::interpModes,(Interpolation *)&DAT_0184ac9c);
    }
    local_118 = CONCAT44(local_118._4_4_,1);
    if (dataType - TYPE_FLOAT_MAT2 < 9 || dataType - TYPE_DOUBLE_MAT2 < 9) {
      iVar3 = glu::getDataTypeMatrixNumColumns(dataType);
      local_118 = CONCAT44(local_118._4_4_,iVar3);
    }
    iVar3 = glu::getDataTypeScalarSize(dataType);
    if (local_110 == 0x8c8d) {
      iVar5 = (int)(4 / (long)iVar3);
    }
    else {
      iVar5 = iVar5 / (int)local_118;
    }
    fVar12 = deRandom_getFloat(&rnd.m_rnd);
    iVar3 = 1;
    if (fVar12 < 0.3) {
      if (iVar5 < 2) {
        iVar5 = 1;
      }
      iVar3 = de::Random::getInt(&rnd,1,iVar5);
    }
    __return_storage_ptr__ = &local_90;
    de::toString<int>(__return_storage_ptr__,&varNdx);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tfVaryings,
                   "v_var",__return_storage_ptr__);
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
    pbVar9 = tfVaryings.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (0.3 <= fVar12) {
      glu::VarType::VarType((VarType *)__return_storage_ptr__,dataType,precision);
      ProgramSpec::addVarying(this_00,(char *)pbVar9,(VarType *)__return_storage_ptr__,interp);
    }
    else {
      glu::VarType::VarType((VarType *)&local_70,dataType,precision);
      glu::VarType::VarType((VarType *)&local_90,(VarType *)&local_70,iVar3);
      ProgramSpec::addVarying(this_00,(char *)pbVar9,(VarType *)&local_90,interp);
      glu::VarType::~VarType((VarType *)&local_90);
      __return_storage_ptr__ = &local_70;
    }
    glu::VarType::~VarType((VarType *)__return_storage_ptr__);
    iVar8 = iVar8 + iVar3 * (int)local_118;
    varNdx = varNdx + 1;
    std::__cxx11::string::~string((string *)&tfVaryings);
  } while( true );
}

Assistant:

void init (void)
	{
		// \note Hard-coded indices and hackery are used when indexing this, beware.
		static const glu::DataType typeCandidates[] =
		{
			glu::TYPE_FLOAT,
			glu::TYPE_FLOAT_VEC2,
			glu::TYPE_FLOAT_VEC3,
			glu::TYPE_FLOAT_VEC4,
			glu::TYPE_INT,
			glu::TYPE_INT_VEC2,
			glu::TYPE_INT_VEC3,
			glu::TYPE_INT_VEC4,
			glu::TYPE_UINT,
			glu::TYPE_UINT_VEC2,
			glu::TYPE_UINT_VEC3,
			glu::TYPE_UINT_VEC4,

			glu::TYPE_FLOAT_MAT2,
			glu::TYPE_FLOAT_MAT2X3,
			glu::TYPE_FLOAT_MAT2X4,

			glu::TYPE_FLOAT_MAT3X2,
			glu::TYPE_FLOAT_MAT3,
			glu::TYPE_FLOAT_MAT3X4,

			glu::TYPE_FLOAT_MAT4X2,
			glu::TYPE_FLOAT_MAT4X3,
			glu::TYPE_FLOAT_MAT4
		};

		static const glu::Precision precisions[] =
		{
			glu::PRECISION_LOWP,
			glu::PRECISION_MEDIUMP,
			glu::PRECISION_HIGHP
		};

		static const Interpolation interpModes[] =
		{
			INTERPOLATION_FLAT,
			INTERPOLATION_SMOOTH,
			INTERPOLATION_CENTROID
		};

		const int	maxAttributeVectors					= 16;
//		const int	maxTransformFeedbackComponents		= 64; // \note It is enough to limit attribute set size.
		bool		isSeparateMode						= m_bufferMode == GL_SEPARATE_ATTRIBS;
		int			maxTransformFeedbackVars			= isSeparateMode ? 4 : maxAttributeVectors;
		const float	arrayWeight							= 0.3f;
		const float	positionWeight						= 0.7f;
		const float	pointSizeWeight						= 0.1f;
		const float	captureFullArrayWeight				= 0.5f;

		de::Random	rnd									(m_seed);
		bool		usePosition							= rnd.getFloat() < positionWeight;
		bool		usePointSize						= rnd.getFloat() < pointSizeWeight;
		int			numAttribVectorsToUse				= rnd.getInt(1, maxAttributeVectors - 1/*position*/ - (usePointSize ? 1 : 0));

		int			numAttributeVectors					= 0;
		int			varNdx								= 0;

		// Generate varyings.
		while (numAttributeVectors < numAttribVectorsToUse)
		{
			int						maxVecs		= isSeparateMode ? de::min(2 /*at most 2*mat2*/, numAttribVectorsToUse-numAttributeVectors) : numAttribVectorsToUse-numAttributeVectors;
			const glu::DataType*	begin		= &typeCandidates[0];
			const glu::DataType*	end			= begin + (maxVecs >= 4 ? 21 :
														   maxVecs >= 3 ? 18 :
														   maxVecs >= 2 ? (isSeparateMode ? 13 : 15) : 12);

			glu::DataType			type		= rnd.choose<glu::DataType>(begin, end);
			glu::Precision			precision	= rnd.choose<glu::Precision>(&precisions[0], &precisions[0]+DE_LENGTH_OF_ARRAY(precisions));
			Interpolation			interp		= glu::getDataTypeScalarType(type) == glu::TYPE_FLOAT
												? rnd.choose<Interpolation>(&interpModes[0], &interpModes[0]+DE_LENGTH_OF_ARRAY(interpModes))
												: INTERPOLATION_FLAT;
			int						numVecs		= glu::isDataTypeMatrix(type) ? glu::getDataTypeMatrixNumColumns(type) : 1;
			int						numComps	= glu::getDataTypeScalarSize(type);
			int						maxArrayLen	= de::max(1, isSeparateMode ? 4/numComps : maxVecs/numVecs);
			bool					useArray	= rnd.getFloat() < arrayWeight;
			int						arrayLen	= useArray ? rnd.getInt(1, maxArrayLen) : 1;
			std::string				name		= "v_var" + de::toString(varNdx);

			if (useArray)
				m_progSpec.addVarying(name.c_str(), glu::VarType(glu::VarType(type, precision), arrayLen), interp);
			else
				m_progSpec.addVarying(name.c_str(), glu::VarType(type, precision), interp);

			numAttributeVectors	+= arrayLen*numVecs;
			varNdx				+= 1;
		}

		// Generate transform feedback candidate set.
		vector<string> tfCandidates;

		if (usePosition)	tfCandidates.push_back("gl_Position");
		if (usePointSize)	tfCandidates.push_back("gl_PointSize");

		for (int ndx = 0; ndx < varNdx /* num varyings */; ndx++)
		{
			const Varying& var = m_progSpec.getVaryings()[ndx];

			if (var.type.isArrayType())
			{
				const bool captureFull = rnd.getFloat() < captureFullArrayWeight;

				if (captureFull)
					tfCandidates.push_back(var.name);
				else
				{
					const int numElem = var.type.getArraySize();
					for (int elemNdx = 0; elemNdx < numElem; elemNdx++)
						tfCandidates.push_back(var.name + "[" + de::toString(elemNdx) + "]");
				}
			}
			else
				tfCandidates.push_back(var.name);
		}

		// Pick random selection.
		vector<string> tfVaryings(de::min((int)tfCandidates.size(), maxTransformFeedbackVars));
		rnd.choose(tfCandidates.begin(), tfCandidates.end(), tfVaryings.begin(), (int)tfVaryings.size());
		rnd.shuffle(tfVaryings.begin(), tfVaryings.end());

		for (vector<string>::const_iterator var = tfVaryings.begin(); var != tfVaryings.end(); var++)
			m_progSpec.addTransformFeedbackVarying(var->c_str());

		TransformFeedbackCase::init();
	}